

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

StringEnumeration * icu_63::MeasureUnit::getAvailableTypes(UErrorCode *errorCode)

{
  UBool UVar1;
  UEnumeration *_uenum;
  UStringEnumeration *this;
  size_t size;
  UStringEnumeration *local_50;
  StringEnumeration *result;
  UEnumeration *uenum;
  UErrorCode *errorCode_local;
  
  size = 0x14;
  _uenum = uenum_openCharStringsEnumeration_63((char **)gTypes,0x14,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this = (UStringEnumeration *)UMemory::operator_new((UMemory *)0x80,size);
    local_50 = (UStringEnumeration *)0x0;
    if (this != (UStringEnumeration *)0x0) {
      UStringEnumeration::UStringEnumeration(this,_uenum);
      local_50 = this;
    }
    if (local_50 == (UStringEnumeration *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      uenum_close_63(_uenum);
      errorCode_local = (UErrorCode *)0x0;
    }
    else {
      errorCode_local = (UErrorCode *)local_50;
    }
  }
  else {
    uenum_close_63(_uenum);
    errorCode_local = (UErrorCode *)0x0;
  }
  return (StringEnumeration *)errorCode_local;
}

Assistant:

StringEnumeration* MeasureUnit::getAvailableTypes(UErrorCode &errorCode) {
    UEnumeration *uenum = uenum_openCharStringsEnumeration(
            gTypes, UPRV_LENGTHOF(gTypes), &errorCode);
    if (U_FAILURE(errorCode)) {
        uenum_close(uenum);
        return NULL;
    }
    StringEnumeration *result = new UStringEnumeration(uenum);
    if (result == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        uenum_close(uenum);
        return NULL;
    }
    return result;
}